

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsLinuxELFLinker::ResolveDependency
          (cmBinUtilsLinuxELFLinker *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchPaths,string *path,bool *resolved)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  ostream *poVar6;
  cmMakefile *this_00;
  _func_int **pp_Var7;
  pointer pbVar8;
  __string_type __str;
  ostringstream warning;
  string local_1d8;
  bool *local_1b8;
  cmBinUtilsLinuxELFLinker *local_1b0;
  undefined1 local_1a8 [16];
  _func_int *local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  pbVar8 = (searchPaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (searchPaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_1b8 = resolved;
  local_1b0 = this;
  if (pbVar8 != pbVar1) {
    do {
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      pcVar2 = (pbVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar2,pcVar2 + pbVar8->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_1d8,local_1d8._M_string_length,0,'\x01');
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1d8,(ulong)(name->_M_dataplus)._M_p);
      pp_Var7 = (_func_int **)(plVar4 + 2);
      if ((_func_int **)*plVar4 == pp_Var7) {
        local_198 = *pp_Var7;
        lStack_190 = plVar4[3];
        local_1a8._0_8_ = &local_198;
      }
      else {
        local_198 = *pp_Var7;
        local_1a8._0_8_ = (_func_int **)*plVar4;
      }
      local_1a8._8_8_ = plVar4[1];
      *plVar4 = (long)pp_Var7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)path,(string *)local_1a8);
      if ((_func_int **)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      bVar3 = cmsys::SystemTools::PathExists(path);
      if (bVar3) {
        *local_1b8 = true;
        return true;
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar1);
  }
  pvVar5 = cmRuntimeDependencyArchive::GetSearchDirectories_abi_cxx11_
                     ((local_1b0->super_cmBinUtilsLinker).Archive);
  pbVar8 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar1) {
    do {
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      pcVar2 = (pbVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar2,pcVar2 + pbVar8->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_1d8,local_1d8._M_string_length,0,'\x01');
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1d8,(ulong)(name->_M_dataplus)._M_p);
      pp_Var7 = (_func_int **)(plVar4 + 2);
      if ((_func_int **)*plVar4 == pp_Var7) {
        local_198 = *pp_Var7;
        lStack_190 = plVar4[3];
        local_1a8._0_8_ = &local_198;
      }
      else {
        local_198 = *pp_Var7;
        local_1a8._0_8_ = (_func_int **)*plVar4;
      }
      local_1a8._8_8_ = plVar4[1];
      *plVar4 = (long)pp_Var7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)path,(string *)local_1a8);
      if ((_func_int **)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      bVar3 = cmsys::SystemTools::PathExists(path);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Dependency ",0xb);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," found in search directory:\n  ",0x1e);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for ",0x36);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"more information.",0x11);
        this_00 = cmRuntimeDependencyArchive::GetMakefile
                            ((local_1b0->super_cmBinUtilsLinker).Archive);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,WARNING,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        *local_1b8 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return true;
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar1);
  }
  *local_1b8 = false;
  return true;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::ResolveDependency(
  std::string const& name, std::vector<std::string> const& searchPaths,
  std::string& path, bool& resolved)
{
  for (auto const& searchPath : searchPaths) {
    path = searchPath + '/' + name;
    if (cmSystemTools::PathExists(path)) {
      resolved = true;
      return true;
    }
  }

  for (auto const& searchPath : this->Archive->GetSearchDirectories()) {
    path = searchPath + '/' + name;
    if (cmSystemTools::PathExists(path)) {
      std::ostringstream warning;
      warning << "Dependency " << name << " found in search directory:\n  "
              << searchPath
              << "\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for "
              << "more information.";
      this->Archive->GetMakefile()->IssueMessage(MessageType::WARNING,
                                                 warning.str());
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}